

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruckig.hpp
# Opt level: O0

bool __thiscall
ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::validate_input<false>
          (Ruckig<3UL,_ruckig::StandardVector,_false> *this,
          InputParameter<3UL,_ruckig::StandardVector> *input,bool check_current_state_within_limits,
          bool check_target_state_within_limits)

{
  bool bVar1;
  size_type sVar2;
  bool check_target_state_within_limits_local;
  bool check_current_state_within_limits_local;
  InputParameter<3UL,_ruckig::StandardVector> *input_local;
  Ruckig<3UL,_ruckig::StandardVector,_false> *this_local;
  
  bVar1 = InputParameter<3UL,_ruckig::StandardVector>::validate<false>
                    (input,check_current_state_within_limits,check_target_state_within_limits);
  if (bVar1) {
    bVar1 = std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::empty
                      (&input->intermediate_positions);
    if (((bVar1) || (input->control_interface != Position)) ||
       (sVar2 = std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
                size(&input->intermediate_positions), sVar2 <= this->max_number_of_waypoints)) {
      if ((0.0 < this->delta_time) || (input->duration_discretization == Continuous)) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool validate_input(const InputParameter<DOFs, CustomVector>& input, bool check_current_state_within_limits = false, bool check_target_state_within_limits = true) const {
        if (!input.template validate<throw_validation_error>(check_current_state_within_limits, check_target_state_within_limits)) {
            return false;
        }

        if (!input.intermediate_positions.empty() && input.control_interface == ControlInterface::Position) {
            if (input.intermediate_positions.size() > max_number_of_waypoints) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("The number of intermediate positions " + std::to_string(input.intermediate_positions.size()) + " exceeds the maximum number of waypoints " + std::to_string(max_number_of_waypoints) + ".");
                }
                return false;
            }
        }

        if (delta_time <= 0.0 && input.duration_discretization != DurationDiscretization::Continuous) {
            if constexpr (throw_validation_error) {
                throw RuckigError("delta time (control rate) parameter " + std::to_string(delta_time) + " should be larger than zero.");
            }
            return false;
        }

        return true;
    }